

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_DecodePCM32F
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  ushort uVar1;
  
  uVar1 = ((voice->field_19).src.format)->nChannels;
  SDL_memcpy(decodeCache,
             buffer->pAudioData + (ulong)((voice->field_19).src.curBufferOffset * (uint)uVar1) * 4,
             (ulong)samples * (ulong)uVar1 * 4);
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM32F(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	LOG_FUNC_ENTER(voice->audio)
	FAudio_memcpy(
		decodeCache,
		((float*) buffer->pAudioData) + (
			voice->src.curBufferOffset * voice->src.format->nChannels
		),
		sizeof(float) * samples * voice->src.format->nChannels
	);
	LOG_FUNC_EXIT(voice->audio)
}